

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.c
# Opt level: O0

int getgoal(line *dlp)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ushort **ppuVar4;
  char local_21 [5];
  char cStack_1c;
  char cStack_1b;
  char cStack_1a;
  char tmp [5];
  int col;
  int i;
  int c;
  line *dlp_local;
  
  cStack_1c = '\0';
  cStack_1b = '\0';
  cStack_1a = '\0';
  tmp[0] = '\0';
  tmp[1] = '\0';
  tmp[2] = '\0';
  tmp[3] = '\0';
  tmp[4] = '\0';
  while( true ) {
    if (dlp->l_used <= (int)tmp._1_4_) {
      iVar3._0_1_ = tmp[1];
      iVar3._1_1_ = tmp[2];
      iVar3._2_1_ = tmp[3];
      iVar3._3_1_ = tmp[4];
      return iVar3;
    }
    uVar1 = (uint)(byte)dlp->l_text[(int)tmp._1_4_];
    if (uVar1 == 9) {
      _cStack_1c = ntabstop(_cStack_1c,curbp->b_tabw);
    }
    else if ((cinfo[uVar1] & 8U) == 0) {
      ppuVar4 = __ctype_b_loc();
      if (((*ppuVar4)[(int)uVar1] & 0x4000) == 0) {
        iVar2 = snprintf(local_21,5,"\\%o",(ulong)uVar1);
        _cStack_1c = iVar2 + _cStack_1c;
      }
      else {
        _cStack_1c = _cStack_1c + 1;
      }
    }
    else {
      _cStack_1c = _cStack_1c + 2;
    }
    if (curgoal < _cStack_1c) break;
    tmp._1_4_ = tmp._1_4_ + 1;
  }
  iVar2._0_1_ = tmp[1];
  iVar2._1_1_ = tmp[2];
  iVar2._2_1_ = tmp[3];
  iVar2._3_1_ = tmp[4];
  return iVar2;
}

Assistant:

int
getgoal(struct line *dlp)
{
	int c, i, col = 0;
	char tmp[5];

	for (i = 0; i < llength(dlp); i++) {
		c = lgetc(dlp, i);
		if (c == '\t') {
			col = ntabstop(col, curbp->b_tabw);
		} else if (ISCTRL(c) != FALSE) {
			col += 2;
		} else if (isprint(c))
			col++;
		else {
			col += snprintf(tmp, sizeof(tmp), "\\%o", c);
		}
		if (col > curgoal)
			break;
	}
	return (i);
}